

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O2

void amrex::EB_average_down
               (MultiFab *S_fine,MultiFab *S_crse,MultiFab *vol_fine,MultiFab *vfrac_fine,int scomp,
               int ncomp,IntVect *ratio)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  FArrayBox *pFVar7;
  FArrayBox *fab;
  double *pdVar8;
  int jref;
  FabType FVar9;
  ulong uVar10;
  int *piVar11;
  EBCellFlagFab *this;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  Periodicity *period;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  int jj;
  long lVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  int iref;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  long local_4c0;
  long local_480;
  long local_478;
  Box local_46c;
  long local_450;
  long local_448;
  ulong local_440;
  long local_438;
  long local_430;
  long local_428;
  double *local_420;
  double *local_418;
  long local_410;
  long local_408;
  long local_400;
  double *local_3f8;
  long local_3f0;
  double *local_3e8;
  long local_3e0;
  double *local_3d8;
  long local_3d0;
  long local_3c8;
  int local_3c0;
  int local_3bc;
  Box result;
  int local_398;
  int local_394;
  int local_390;
  MFIter mfi;
  Array4<const_double> local_258;
  BoxArray crse_S_fine_BA;
  MultiFab crse_S_fine;
  
  BoxArray::BoxArray(&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  BoxArray::coarsen(&crse_S_fine_BA,ratio);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  result.smallend.vect._0_8_ = &PTR__FabFactory_007d2928;
  MultiFab::MultiFab(&crse_S_fine,&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     ncomp,0,(MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&result);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  local_3f0 = (long)ratio->vect[0];
  local_438 = (long)ratio->vect[1];
  local_450 = (long)ratio->vect[2];
  MFIter::MFIter(&mfi,(FabArrayBase *)&crse_S_fine,true);
  uVar10 = 0;
  if (0 < ncomp) {
    uVar10 = (ulong)(uint)ncomp;
  }
  lVar1 = (long)scomp * 8;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_46c,&mfi);
    piVar11 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar11 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + mfi.currentIndex;
    }
    pFVar7 = crse_S_fine.super_FabArray<amrex::FArrayBox>.m_fabs_v.
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start[*piVar11];
    fab = (S_fine->super_FabArray<amrex::FArrayBox>).m_fabs_v.
          super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
          super__Vector_impl_data._M_start[*piVar11];
    this = getEBCellFlagFab(fab);
    result.smallend.vect[1] = local_46c.smallend.vect[1];
    result.smallend.vect[0] = local_46c.smallend.vect[0];
    result.bigend.vect[1] = local_46c.bigend.vect[1];
    result.bigend.vect[2] = local_46c.bigend.vect[2];
    result.smallend.vect[2] = local_46c.smallend.vect[2];
    result.bigend.vect[0] = local_46c.bigend.vect[0];
    iVar2 = ratio->vect[0];
    iVar3 = ratio->vect[1];
    iVar4 = ratio->vect[2];
    if (iVar4 != 1 || (iVar3 != 1 || iVar2 != 1)) {
      uVar5 = (uint)((local_46c.btype.itype & 2) == 0);
      result.smallend.vect[1] = local_46c.smallend.vect[1] * iVar3;
      result.smallend.vect[0] = local_46c.smallend.vect[0] * iVar2;
      result.smallend.vect[2] = local_46c.smallend.vect[2] * iVar4;
      uVar35 = (uint)((local_46c.btype.itype & 4) == 0);
      result.bigend.vect[0] =
           (local_46c.bigend.vect[0] + (~local_46c.btype.itype & 1)) * iVar2 -
           (~local_46c.btype.itype & 1);
      result.bigend.vect[1] = (local_46c.bigend.vect[1] + uVar5) * iVar3 - uVar5;
      result.bigend.vect[2] = (local_46c.bigend.vect[2] + uVar35) * iVar4 - uVar35;
    }
    FVar9 = EBCellFlagFab::getType(this,&result);
    pdVar8 = (pFVar7->super_BaseFab<double>).dptr;
    iVar2 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[0];
    iVar3 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[1];
    iVar4 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[2];
    lVar12 = (long)(((pFVar7->super_BaseFab<double>).domain.bigend.vect[0] - iVar2) + 1);
    lVar20 = (((pFVar7->super_BaseFab<double>).domain.bigend.vect[1] - iVar3) + 1) * lVar12;
    lVar13 = (((pFVar7->super_BaseFab<double>).domain.bigend.vect[2] - iVar4) + 1) * lVar20;
    pdVar23 = (fab->super_BaseFab<double>).dptr;
    iVar17 = (fab->super_BaseFab<double>).domain.smallend.vect[0];
    lVar27 = (long)iVar17;
    iVar19 = (fab->super_BaseFab<double>).domain.smallend.vect[1];
    lVar43 = (long)iVar19;
    iVar18 = (fab->super_BaseFab<double>).domain.smallend.vect[2];
    lVar30 = (long)iVar18;
    lVar40 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[0] - iVar17) + 1);
    lVar14 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[1] - iVar19) + 1);
    lVar25 = (long)(((fab->super_BaseFab<double>).domain.bigend.vect[2] - iVar18) + 1);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)&result,&vol_fine->super_FabArray<amrex::FArrayBox>,&mfi);
    local_428 = lVar40;
    if ((uint)(FVar9 + singlevalued) < 2) {
      local_420 = (double *)(long)local_46c.smallend.vect[1];
      local_448 = (long)local_46c.smallend.vect[2];
      local_3e8 = (double *)(ulong)(uint)local_46c.bigend.vect[0];
      local_3d8 = (double *)(long)local_46c.bigend.vect[1];
      local_410 = (long)local_46c.bigend.vect[2];
      lVar27 = (long)pdVar23 + lVar40 * lVar25 * lVar1 * lVar14 + lVar27 * -8;
      lVar37 = lVar14 * 8 * lVar40;
      local_430 = (long)local_420 * 8;
      uVar26 = 0;
      while (uVar21 = uVar26, uVar21 != uVar10) {
        local_418 = pdVar8 + lVar13 * uVar21;
        lVar33 = local_448;
        while (lVar16 = lVar33, lVar16 <= local_410) {
          uVar5 = ratio->vect[0];
          uVar35 = ratio->vect[1];
          lVar33 = (long)(int)uVar35;
          uVar6 = ratio->vect[2];
          local_3f8 = local_418 + (lVar16 - iVar4) * lVar20;
          uVar26 = 0;
          if (0 < (int)uVar5) {
            uVar26 = (ulong)uVar5;
          }
          uVar45 = 0;
          if (0 < (int)uVar35) {
            uVar45 = (ulong)uVar35;
          }
          uVar28 = 0;
          if (0 < (int)uVar6) {
            uVar28 = (ulong)uVar6;
          }
          local_400 = (long)local_46c.smallend.vect[0] * 8 * (long)(int)uVar5;
          local_3d0 = (int)uVar6 * lVar16;
          local_480 = ((local_3d0 - lVar30) * lVar14 * 8 + local_430 * lVar33 + lVar43 * -8) *
                      lVar40 + lVar27 + local_400;
          local_3e0 = lVar40 * 8 * lVar33;
          local_3c8 = (long)(int)uVar5 * 8;
          local_4c0 = (long)local_420 * lVar33;
          for (pdVar23 = local_420; (long)pdVar23 <= (long)local_3d8;
              pdVar23 = (double *)((long)pdVar23 + 1)) {
            if (local_46c.smallend.vect[0] <= local_46c.bigend.vect[0]) {
              lVar39 = (long)local_46c.smallend.vect[0];
              lVar42 = local_480;
              lVar48 = local_400;
              do {
                lVar34 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
                lVar32 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
                lVar47 = (local_3d0 - local_390) * lVar32 +
                         (local_4c0 - local_394) * lVar34 + lVar48 + (long)local_398 * -8 +
                         result.smallend.vect._0_8_;
                dVar49 = 0.0;
                dVar50 = 0.0;
                lVar36 = lVar42;
                for (uVar31 = 0; uVar31 != uVar28; uVar31 = uVar31 + 1) {
                  lVar22 = lVar47;
                  lVar41 = lVar36;
                  for (uVar15 = 0; uVar15 != uVar45; uVar15 = uVar15 + 1) {
                    for (uVar44 = 0; uVar26 != uVar44; uVar44 = uVar44 + 1) {
                      dVar51 = *(double *)(lVar22 + uVar44 * 8);
                      dVar50 = dVar50 + dVar51;
                      dVar49 = dVar49 + dVar51 * *(double *)(lVar41 + uVar44 * 8);
                    }
                    lVar41 = lVar41 + lVar40 * 8;
                    lVar22 = lVar22 + lVar34;
                  }
                  lVar36 = lVar36 + lVar37;
                  lVar47 = lVar47 + lVar32;
                }
                local_3f8[((long)pdVar23 - (long)iVar3) * lVar12 + (lVar39 - iVar2)] =
                     dVar49 / dVar50;
                lVar39 = lVar39 + 1;
                lVar42 = lVar42 + local_3c8;
                lVar48 = lVar48 + local_3c8;
              } while (local_46c.bigend.vect[0] + 1U != (int)lVar39);
            }
            local_480 = local_480 + local_3e0;
            local_4c0 = local_4c0 + lVar33;
          }
          local_408 = lVar16;
          lVar33 = lVar16 + 1;
        }
        lVar27 = lVar27 + lVar25 * lVar37;
        local_440 = uVar21;
        uVar26 = uVar21 + 1;
      }
    }
    else if (FVar9 == singlevalued) {
      lVar33 = lVar14 * lVar40;
      local_3e0 = lVar33 * lVar25;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_258,&vfrac_fine->super_FabArray<amrex::FArrayBox>,&mfi);
      local_408 = (long)local_46c.bigend.vect[0];
      local_440 = (ulong)local_46c.bigend.vect[1];
      local_3bc = local_46c.smallend.vect[0] * (int)local_3f0;
      local_3c0 = local_46c.smallend.vect[1] * (int)local_438;
      iVar17 = local_46c.smallend.vect[2] * (int)local_450;
      local_3d0 = lVar33 * 8;
      lVar37 = (long)local_46c.smallend.vect[2];
      while (lVar37 <= local_46c.bigend.vect[2]) {
        lVar39 = (long)iVar17;
        local_448 = (lVar1 * lVar25 + lVar30 * -8 + lVar39 * 8) * lVar14 + lVar43 * -8;
        lVar16 = (long)local_46c.smallend.vect[1];
        iVar19 = local_3c0;
        while (lVar16 <= (long)local_440) {
          lVar42 = (long)iVar19;
          local_410 = (long)pdVar23 + (local_448 + lVar42 * 8) * local_428 + lVar27 * -8;
          local_430 = lVar16 + 1;
          local_418 = pdVar23 + (lVar37 * local_450 - lVar30) * lVar33 +
                                (lVar16 * local_438 - lVar43) * local_428;
          local_420 = pdVar8 + (lVar37 - iVar4) * lVar20 + (lVar16 - iVar3) * lVar12;
          lVar16 = (long)local_46c.smallend.vect[0];
          iVar18 = local_3bc;
          while (lVar16 <= local_408) {
            local_3f8 = (double *)CONCAT44(local_3f8._4_4_,iVar18);
            lVar48 = (long)iVar18;
            local_478 = local_410 + lVar48 * 8;
            local_400 = lVar16 + 1;
            local_3e8 = local_418 + (lVar16 * local_3f0 - lVar27);
            local_3d8 = local_420 + (lVar16 - iVar2);
            for (uVar26 = 0; uVar26 != uVar10; uVar26 = uVar26 + 1) {
              local_3c8 = local_258.kstride * 8;
              lVar34 = (long)local_258.p +
                       (lVar42 - local_258.begin.y) * local_258.jstride * 8 +
                       (lVar39 - local_258.begin.z) * local_3c8 + (long)local_258.begin.x * -8 +
                       lVar48 * 8;
              lVar47 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
              lVar22 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
              lVar32 = (lVar42 - local_394) * lVar22 + (lVar39 - local_390) * lVar47 +
                       (long)local_398 * -8 + result.smallend.vect._0_8_ + lVar48 * 8;
              dVar49 = 0.0;
              dVar50 = 0.0;
              lVar16 = local_478;
              for (lVar36 = lVar39; lVar41 = lVar42, lVar29 = lVar16, lVar38 = lVar34,
                  lVar46 = lVar32, lVar36 < (lVar37 + 1) * local_450; lVar36 = lVar36 + 1) {
                for (; lVar41 < local_430 * local_438; lVar41 = lVar41 + 1) {
                  for (lVar24 = 0; lVar48 + lVar24 < local_400 * local_3f0; lVar24 = lVar24 + 1) {
                    dVar51 = *(double *)(lVar46 + lVar24 * 8) * *(double *)(lVar38 + lVar24 * 8);
                    dVar49 = dVar49 + *(double *)(lVar29 + lVar24 * 8) * dVar51;
                    dVar50 = dVar50 + dVar51;
                  }
                  lVar29 = lVar29 + lVar40 * 8;
                  lVar38 = lVar38 + local_258.jstride * 8;
                  lVar46 = lVar46 + lVar22;
                }
                lVar16 = lVar16 + lVar33 * 8;
                lVar34 = lVar34 + local_3c8;
                lVar32 = lVar32 + lVar47;
              }
              if (dVar50 <= 1e-30) {
                dVar49 = local_3e8[((long)scomp + uVar26) * local_3e0];
              }
              else {
                dVar49 = dVar49 / dVar50;
              }
              local_3d8[lVar13 * uVar26] = dVar49;
              local_478 = local_478 + lVar25 * local_3d0;
            }
            iVar18 = iVar18 + (int)local_3f0;
            lVar16 = local_400;
          }
          iVar19 = iVar19 + (int)local_438;
          lVar16 = local_430;
        }
        iVar17 = iVar17 + (int)local_450;
        lVar37 = lVar37 + 1;
      }
    }
    else {
      Abort_host("multi-valued avgdown to be implemented");
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  period = Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy
            (&S_crse->super_FabArray<amrex::FArrayBox>,&crse_S_fine.super_FabArray<amrex::FArrayBox>
             ,0,scomp,ncomp,period,COPY);
  MultiFab::~MultiFab(&crse_S_fine);
  BoxArray::~BoxArray(&crse_S_fine_BA);
  return;
}

Assistant:

void
EB_average_down (const MultiFab& S_fine, MultiFab& S_crse, const MultiFab& vol_fine,
                 const MultiFab& vfrac_fine, int scomp, int ncomp, const IntVect& ratio)
{
    BL_PROFILE("EB_average_down");

    AMREX_ASSERT(S_fine.ixType().cellCentered());
    AMREX_ASSERT(S_crse.ixType().cellCentered());

    const DistributionMapping& fine_dm = S_fine.DistributionMap();
    BoxArray crse_S_fine_BA = S_fine.boxArray();
    crse_S_fine_BA.coarsen(ratio);

    MultiFab crse_S_fine(crse_S_fine_BA,fine_dm,ncomp,0,MFInfo(),FArrayBoxFactory());

    Dim3 dratio = ratio.dim3();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crse_S_fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& tbx = mfi.tilebox();
        auto& crse_fab = crse_S_fine[mfi];
        const auto& fine_fab = S_fine[mfi];

        const auto& flag_fab = amrex::getEBCellFlagFab(fine_fab);
        FabType typ = flag_fab.getType(amrex::refine(tbx,ratio));

        Array4<Real> const& crse_arr = crse_fab.array();
        Array4<Real const> const& fine_arr = fine_fab.const_array();
        Array4<Real const> const& vol = vol_fine.const_array(mfi);

        if (typ == FabType::regular || typ == FabType::covered)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, ncomp, i, j, k, n,
            {
                amrex_avgdown_with_vol(i,j,k,n, crse_arr, fine_arr, vol, 0, scomp, ratio);
            });
        }
        else if (typ == FabType::singlevalued)
        {
            Array4<Real const> const& vfrac = vfrac_fine.const_array(mfi);
            AMREX_HOST_DEVICE_FOR_3D(tbx, i, j, k,
            {
                eb_avgdown_with_vol(i,j,k,fine_arr,scomp,crse_arr,0,vol,vfrac,dratio,ncomp);
            });
        }
        else
        {
            amrex::Abort("multi-valued avgdown to be implemented");
        }
    }

    S_crse.ParallelCopy(crse_S_fine,0,scomp,ncomp);
}